

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

void __thiscall
libsbox::Task::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Task *this,Value *value)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  SizeType SVar4;
  ContextManager *pCVar5;
  Type pGVar6;
  int64_t iVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar8;
  BindRule local_520;
  allocator<char> local_4d1;
  string local_4d0 [32];
  ulong local_4b0;
  size_t i_2;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [32];
  Ch *local_458;
  allocator<char> local_449;
  string local_448 [32];
  ulong local_428;
  size_t i_1;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [32];
  Ch *local_3d0;
  allocator<char> local_3c1;
  string local_3c0 [32];
  ulong local_3a0;
  size_t i;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_18;
  Value *value_local;
  Task *this_local;
  
  local_18 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)value;
  value_local = (Value *)this;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(value);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"JSON is incorrect",&local_39);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"time_limit_ms");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"JSON is incorrect",&local_71);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"time_limit_ms");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt64(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,"JSON is incorrect",&local_99);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"time_limit_ms");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->time_limit_ms_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"wall_time_limit_ms");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"JSON is incorrect",&local_c1);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"wall_time_limit_ms");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt64(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"JSON is incorrect",&local_e9);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"wall_time_limit_ms");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->wall_time_limit_ms_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"memory_limit_kb");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_110,"JSON is incorrect",&local_111);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"memory_limit_kb");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt64(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"JSON is incorrect",&local_139);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_138);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"memory_limit_kb");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->memory_limit_kb_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"fsize_limit_kb");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_160,"JSON is incorrect",&local_161);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_160);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"fsize_limit_kb");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt64(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"JSON is incorrect",&local_189);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"fsize_limit_kb");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->fsize_limit_kb_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"max_files");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,"JSON is incorrect",&local_1b1);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"max_files");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d8,"JSON is incorrect",&local_1d9);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"max_files");
  iVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar6);
  this->max_files_ = iVar3;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"max_threads");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_200,"JSON is incorrect",&local_201);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_200);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"max_threads");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_228,"JSON is incorrect",&local_229);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_228);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator(&local_229);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"max_threads");
  iVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar6);
  this->max_threads_ = iVar3;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"need_ipc");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_250,"JSON is incorrect",&local_251);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_250);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator(&local_251);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"need_ipc");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsBool(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_278,"JSON is incorrect",&local_279);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_278);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"need_ipc");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetBool(pGVar6);
  this->need_ipc_ = bVar2;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"use_standard_binds");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2a0,"JSON is incorrect",&local_2a1);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_2a0);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"use_standard_binds");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsBool(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2c8,"JSON is incorrect",&local_2c9);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"use_standard_binds");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetBool(pGVar6);
  this->use_standard_binds_ = bVar2;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"stdin");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2f0,"JSON is incorrect",&local_2f1);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_2f0);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"stdin");
  Stream::
  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&this->stdin_,pGVar6);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"stdout");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_318,"JSON is incorrect",&local_319);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_318);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"stdout");
  Stream::
  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&this->stdout_,pGVar6);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"stderr");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_340,"JSON is incorrect",&local_341);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_340);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator(&local_341);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"stderr");
  Stream::
  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&(this->stderr_).super_Stream,pGVar6);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"argv");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_368,"JSON is incorrect",&local_369);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_368);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator(&local_369);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"argv");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_390,"JSON is incorrect",(allocator<char> *)((long)&i + 7));
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_390);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->argv_);
  local_3a0 = 0;
  while( true ) {
    uVar1 = local_3a0;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"argv");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (SVar4 <= uVar1) break;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"argv");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)local_3a0);
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(pGVar8);
    if (!bVar2) {
      pCVar5 = ContextManager::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3c0,"JSON is incorrect",&local_3c1);
      (**pCVar5->_vptr_ContextManager)(pCVar5,local_3c0);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"argv");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)local_3a0);
    local_3d0 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetString(pGVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->argv_,
               &local_3d0);
    local_3a0 = local_3a0 + 1;
  }
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"env");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3f0,"JSON is incorrect",&local_3f1);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_3f0);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"env");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_418,"JSON is incorrect",(allocator<char> *)((long)&i_1 + 7));
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_418);
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->env_);
  local_428 = 0;
  while( true ) {
    uVar1 = local_428;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"env");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (SVar4 <= uVar1) break;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"env");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)local_428);
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(pGVar8);
    if (!bVar2) {
      pCVar5 = ContextManager::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_448,"JSON is incorrect",&local_449);
      (**pCVar5->_vptr_ContextManager)(pCVar5,local_448);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator(&local_449);
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"env");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)local_428);
    local_458 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetString(pGVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->env_,
               &local_458);
    local_428 = local_428 + 1;
  }
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"binds");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_478,"JSON is incorrect",&local_479);
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_478);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator(&local_479);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"binds");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(pGVar6);
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_4a0,"JSON is incorrect",(allocator<char> *)((long)&i_2 + 7));
    (**pCVar5->_vptr_ContextManager)(pCVar5,local_4a0);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 7));
  }
  std::vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>::clear(&this->binds_);
  local_4b0 = 0;
  while( true ) {
    uVar1 = local_4b0;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"binds");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (SVar4 <= uVar1) break;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"binds");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)local_4b0);
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(pGVar8);
    if (!bVar2) {
      pCVar5 = ContextManager::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_4d0,"JSON is incorrect",&local_4d1);
      (**pCVar5->_vptr_ContextManager)(pCVar5,local_4d0);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(local_18,"binds");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)local_4b0);
    BindRule::
    BindRule<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&local_520,pGVar8);
    std::vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>::push_back
              (&this->binds_,&local_520);
    BindRule::~BindRule(&local_520);
    local_4b0 = local_4b0 + 1;
  }
  return;
}

Assistant:

void Task::deserialize_request(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(time_limit_ms_, value, "time_limit_ms", Int64);
    GET_MEMBER(wall_time_limit_ms_, value, "wall_time_limit_ms", Int64);
    GET_MEMBER(memory_limit_kb_, value, "memory_limit_kb", Int64);
    GET_MEMBER(fsize_limit_kb_, value, "fsize_limit_kb", Int64);
    GET_MEMBER(max_files_, value, "max_files", Int);
    GET_MEMBER(max_threads_, value, "max_threads", Int);
    GET_MEMBER(need_ipc_, value, "need_ipc", Bool);
    GET_MEMBER(use_standard_binds_, value, "use_standard_binds", Bool);
    CHECK_MEMBER(value, "stdin");
    stdin_.deserialize_request(value["stdin"]);
    CHECK_MEMBER(value, "stdout");
    stdout_.deserialize_request(value["stdout"]);
    CHECK_MEMBER(value, "stderr");
    stderr_.deserialize_request(value["stderr"]);
    CHECK_MEMBER(value, "argv");
    CHECK_TYPE(value["argv"], Array);
    argv_.clear();
    for (size_t i = 0; i < value["argv"].Size(); ++i) {
        CHECK_TYPE(value["argv"][i], String);
        argv_.emplace_back(value["argv"][i].GetString());
    }
    CHECK_MEMBER(value, "env");
    CHECK_TYPE(value["env"], Array);
    env_.clear();
    for (size_t i = 0; i < value["env"].Size(); ++i) {
        CHECK_TYPE(value["env"][i], String);
        env_.emplace_back(value["env"][i].GetString());
    }
    CHECK_MEMBER(value, "binds");
    CHECK_TYPE(value["binds"], Array);
    binds_.clear();
    for (size_t i = 0; i < value["binds"].Size(); ++i) {
        CHECK_TYPE(value["binds"][i], Object);
        binds_.push_back(BindRule(value["binds"][i]));
    }
}